

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_clb(_func_ssize_t_void_ptr_void_ptr_size_t *writeclb,void *arg,lyd_node *root,
                 LYD_FORMAT format,int options)

{
  int iVar1;
  undefined1 auStack_58 [8];
  lyout out;
  
  if (writeclb == (_func_ssize_t_void_ptr_void_ptr_size_t *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_clb");
    iVar1 = 1;
  }
  else {
    out.method.mem.len = 0;
    out.buf_len = 0;
    out.buf_size = 0;
    out.method.mem.size = 0;
    out.buffered = (char *)0x0;
    auStack_58 = (undefined1  [8])0x3;
    out._0_8_ = writeclb;
    out.method.f = (FILE *)arg;
    iVar1 = lyd_print_((lyout *)auStack_58,root,format,options);
    free((void *)out.method.mem.size);
  }
  return iVar1;
}

Assistant:

API int
lyd_print_clb(ssize_t (*writeclb)(void *arg, const void *buf, size_t count), void *arg, const struct lyd_node *root,
              LYD_FORMAT format, int options)
{
    int r;
    struct lyout out;

    if (!writeclb) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_CALLBACK;
    out.method.clb.f = writeclb;
    out.method.clb.arg = arg;

    r = lyd_print_(&out, root, format, options);

    free(out.buffered);
    return r;
}